

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

ConvexH * ConvexDecomposition::ConvexHCrop(ConvexH *convex,Plane *slice)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  ushort uVar6;
  undefined4 uVar7;
  Plane *pPVar8;
  float3 *pfVar9;
  float3 *pfVar10;
  undefined8 uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar15;
  short sVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uchar *puVar21;
  ConvexH *this;
  byte bVar22;
  int iVar23;
  float *pfVar24;
  char *__function;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ushort *puVar28;
  ulong uVar29;
  ulong uVar30;
  byte bVar31;
  short sVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  HalfEdge *pHVar36;
  byte bVar37;
  uint uVar38;
  ulong uVar39;
  byte bVar40;
  uint uVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  float3 fVar44;
  VertFlag vertflag [256];
  HalfEdge tmpunderedges [512];
  Coplanar coplanaredges [512];
  EdgeFlag edgeflag [512];
  Plane tmpunderplanes [128];
  short asStack_31436 [95697];
  uint local_2894;
  uint local_2884;
  uint local_2878;
  uint local_2874;
  Array<ConvexDecomposition::float3> local_2858;
  ConvexH *local_2848;
  long local_2840;
  byte abStack_2838 [1024];
  short local_2438;
  byte abStack_2436 [2046];
  ushort local_1c38;
  uchar auStack_1c36 [2];
  undefined4 local_1c34;
  short asStack_1436 [1535];
  Plane local_838 [128];
  
  if (ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::vertscoplanar ==
      '\0') {
    ConvexHCrop();
  }
  ConvexHCrop::vertscoplanar.count = 0;
  if (ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::edgesplit ==
      '\0') {
    ConvexHCrop();
  }
  ConvexHCrop::edgesplit.count = 0;
  if (0x1df < (convex->edges).count) {
    __assert_fail("convex.edges.count<480",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x745,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
  }
  memset(local_838,0,0x800);
  local_2858 = (Array<ConvexDecomposition::float3>)(ZEXT816(0) << 0x40);
  uVar38 = 0;
  lVar19 = (long)(convex->vertices).count;
  if (0 < lVar19) {
    uVar38 = 0;
    bVar31 = 0;
    fVar1 = (slice->normal).x;
    fVar2 = (slice->normal).y;
    fVar3 = (slice->normal).z;
    fVar4 = slice->dist;
    pfVar24 = &((convex->vertices).element)->z;
    lVar27 = 0;
    auVar43._8_4_ = 0x80000000;
    auVar43._0_8_ = 0x8000000080000000;
    auVar43._12_4_ = 0x80000000;
    auVar43 = vxorps_avx512vl(ZEXT416((uint)planetestepsilon),auVar43);
    do {
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * pfVar24[-1])),ZEXT416((uint)fVar1),
                                ZEXT416((uint)((float3 *)(pfVar24 + -2))->x));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar3),ZEXT416((uint)*pfVar24));
      fVar12 = auVar13._0_4_ + fVar4;
      bVar37 = fVar12 < auVar43._0_4_;
      if (planetestepsilon < fVar12) {
        bVar37 = 2;
      }
      abStack_2838[lVar27 * 4] = bVar37;
      if (bVar37 == 2) {
        abStack_2838[lVar27 * 4 + 3] = bVar31;
        bVar31 = bVar31 + 1;
        abStack_2838[lVar27 * 4 + 2] = 0xff;
      }
      else {
        if (bVar37 == 1) {
          abStack_2838[lVar27 * 4 + 2] = (byte)uVar38;
        }
        else {
          abStack_2838[lVar27 * 4 + 2] = (byte)uVar38;
          abStack_2838[lVar27 * 4 + 3] = bVar31;
          bVar31 = bVar31 + 1;
        }
        uVar38 = uVar38 + 1;
      }
      lVar27 = lVar27 + 1;
      pfVar24 = pfVar24 + 3;
    } while (lVar19 != lVar27);
  }
  uVar15 = uVar38;
  if ((convex->facets).count < 1) {
    uVar33 = 0;
    uVar18 = 0;
    bVar42 = false;
    iVar34 = 0;
  }
  else {
    uVar39 = 0;
    uVar18 = 0;
    uVar33 = 0;
    iVar34 = 0;
    local_2848 = convex;
    uVar17 = 0;
    do {
      local_2878 = 0xffffffff;
      local_2894 = 0xffffffff;
      local_2884 = 0xffffffff;
      local_2874 = 0;
      local_2840 = (ulong)uVar17 << 2;
      uVar30 = (ulong)uVar17;
      bVar31 = 0;
      do {
        iVar23 = (convex->edges).count;
        uVar41 = (uint)uVar30;
        uVar25 = uVar41 + 1;
        uVar26 = uVar25;
        uVar14 = uVar17;
        if ((int)uVar25 < iVar23) {
          if ((int)uVar41 < -1) goto LAB_00905d7f;
          if (uVar39 == (convex->edges).element[uVar25].p) {
            uVar26 = local_2874;
            uVar14 = uVar25;
          }
        }
        local_2874 = uVar26;
        if (((((int)uVar41 < 0) || (iVar23 <= (int)uVar41)) || ((int)uVar14 < 0)) ||
           (iVar23 <= (int)uVar14)) goto LAB_00905d7f;
        pHVar36 = (convex->edges).element;
        sVar16 = pHVar36[uVar30].ea;
        uVar26 = (uint)sVar16;
        if ((sVar16 < 0) || (iVar23 <= (int)uVar26)) goto LAB_00905d7f;
        uVar29 = (ulong)pHVar36[uVar30].v;
        uVar35 = (ulong)pHVar36[uVar14].v;
        bVar37 = abStack_2838[uVar29 * 4];
        bVar5 = abStack_2838[uVar35 * 4];
        bVar40 = bVar31 | bVar37;
        if ((bVar37 == 2) && (bVar5 == 2)) {
LAB_0090552b:
          asStack_1436[uVar30 * 3] = -1;
        }
        else {
          sVar32 = (short)uVar33;
          bVar22 = (byte)iVar34;
          if ((bVar5 | bVar37) == 0) {
            uVar41 = uVar14 + 1;
            if ((iVar23 <= (int)uVar41) || (uVar39 != pHVar36[uVar41].p)) {
              uVar41 = uVar17;
            }
            if (((int)uVar41 < 0) || (iVar23 <= (int)uVar41)) goto LAB_00905d7f;
            if (uVar39 != pHVar36[uVar41].p) {
              __assert_fail("convex.edges[e2].p==currentplane",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x79a,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            if (abStack_2838[(ulong)pHVar36[uVar41].v * 4] != 1) goto LAB_0090552b;
            asStack_1436[uVar30 * 3] = sVar32;
            lVar19 = (long)(int)uVar33;
            local_2884 = (uint)abStack_2838[uVar29 * 4 + 2];
            abStack_2436[lVar19 * 4] = abStack_2838[uVar29 * 4 + 2];
            abStack_2436[lVar19 * 4 + 1] = bVar22;
            bVar31 = abStack_2838[uVar35 * 4 + 2];
            (&local_2438)[lVar19 * 2] = -1;
            uVar41 = uVar33 + 1;
            local_2878 = uVar33;
LAB_00905948:
            local_2894 = (uint)bVar31;
            uVar33 = uVar41;
          }
          else {
            lVar19 = (long)(int)uVar26;
            if ((bVar5 | bVar37) == 1) {
              bVar31 = abStack_2838[uVar29 * 4 + 2];
              asStack_1436[uVar30 * 3] = sVar32;
              lVar27 = (long)(int)uVar33;
              abStack_2436[lVar27 * 4] = bVar31;
              abStack_2436[lVar27 * 4 + 1] = bVar22;
              if (uVar26 < uVar41) {
                sVar16 = asStack_1436[lVar19 * 3];
                if ((long)sVar16 == -1) {
                  __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x78d,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                (&local_2438)[lVar27 * 2] = sVar16;
                (&local_2438)[(long)sVar16 * 2] = sVar32;
              }
              uVar33 = uVar33 + 1;
            }
            else if ((bVar37 == 1) && (bVar5 == 2)) {
              bVar31 = abStack_2838[uVar29 * 4 + 2];
              asStack_1436[uVar30 * 3] = sVar32;
              lVar27 = (long)(int)uVar33;
              abStack_2436[lVar27 * 4] = bVar31;
              abStack_2436[lVar27 * 4 + 1] = bVar22;
              if (uVar26 < uVar41) {
                lVar20 = (long)asStack_1436[lVar19 * 3];
                if (lVar20 == -1) {
                  __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7b3,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                (&local_2438)[lVar27 * 2] = asStack_1436[lVar19 * 3];
                (&local_2438)[lVar20 * 2] = sVar32;
                local_2884 = (uint)abStack_2436[lVar20 * 4];
                uVar41 = uVar15;
              }
              else {
                uVar41 = (local_2848->facets).count;
                if (((int)uVar41 <= (int)(uint)pHVar36[uVar30].p) || (uVar41 <= pHVar36[uVar26].p))
                goto LAB_00905ddc;
                pPVar8 = (local_2848->facets).element;
                fVar44 = ThreePlaneIntersection
                                   (pPVar8 + pHVar36[uVar30].p,pPVar8 + pHVar36[uVar26].p,slice);
                Array<ConvexDecomposition::float3>::Add(&local_2858,fVar44);
                uVar41 = uVar15 + 1;
                local_2884 = uVar15;
              }
              abStack_2436[lVar27 * 4 + 4] = (byte)local_2884;
              local_2878 = uVar33 + 1;
              abStack_2436[lVar27 * 4 + 5] = bVar22;
              (abStack_2436 + lVar27 * 4 + 2)[0] = 0xff;
              (abStack_2436 + lVar27 * 4 + 2)[1] = 0xff;
              convex = local_2848;
              uVar15 = uVar41;
              uVar33 = uVar33 + 2;
            }
            else if (bVar37 == 0) {
              if (bVar5 != 2) goto LAB_00905df3;
              asStack_1436[uVar30 * 3] = -1;
              if (uVar39 != pHVar36[uVar30].p) {
                __assert_fail("edge0.p == currentplane",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x7d9,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              local_2884 = (uint)abStack_2838[uVar29 * 4 + 2];
              bVar42 = (bVar31 & 1) == 0;
              if ((bVar42) && ((int)uVar17 < iVar23)) {
                puVar21 = &pHVar36->p + local_2840;
                uVar41 = uVar17;
                do {
                  if (((int)uVar17 < 0) || (iVar23 <= (int)uVar41)) goto LAB_00905d7f;
                  if (*puVar21 != pHVar36[uVar30].p) goto LAB_0090594f;
                  bVar40 = bVar40 | abStack_2838[(ulong)puVar21[-1] * 4];
                  bVar42 = (bVar40 & 1) == 0;
                  if (!bVar42) break;
                  uVar41 = uVar41 + 1;
                  puVar21 = puVar21 + 4;
                } while ((int)uVar41 < iVar23);
              }
              if (!bVar42) {
                lVar19 = (long)(int)uVar33;
                abStack_2436[lVar19 * 4] = abStack_2838[uVar29 * 4 + 2];
                abStack_2436[lVar19 * 4 + 1] = bVar22;
                (&local_2438)[lVar19 * 2] = -1;
                local_2878 = uVar33;
                uVar33 = uVar33 + 1;
              }
            }
            else {
              if (bVar37 != 2) {
LAB_00905df3:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x81b,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              if (bVar5 == 0) {
                asStack_1436[uVar30 * 3] = -1;
                bVar31 = abStack_2838[uVar35 * 4 + 2];
                uVar41 = uVar33;
                goto LAB_00905948;
              }
              if (bVar5 != 1) goto LAB_00905df3;
              if (local_2894 != 0xffffffff) {
                __assert_fail("vin==-1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x7ea,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              if (uVar41 < uVar26) {
                uVar25 = (convex->facets).count;
                if (((int)uVar25 <= (int)(uint)pHVar36[uVar30].p) || (uVar25 <= pHVar36[uVar26].p))
                goto LAB_00905ddc;
                pPVar8 = (convex->facets).element;
                fVar44 = ThreePlaneIntersection
                                   (pPVar8 + pHVar36[uVar30].p,pPVar8 + pHVar36[uVar26].p,slice);
                Array<ConvexDecomposition::float3>::Add(&local_2858,fVar44);
                sVar16 = pHVar36[uVar30].ea;
                uVar26 = (uint)sVar16;
                local_2894 = uVar15;
                uVar15 = uVar15 + 1;
              }
              else {
                lVar19 = (long)asStack_1436[lVar19 * 3];
                if (abStack_2436[lVar19 * 4 + 1] != abStack_2436[lVar19 * 4 + 5]) {
                  __assert_fail("tmpunderedges[nea].p==tmpunderedges[nea+1].p",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7f6,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                bVar31 = abStack_2436[lVar19 * 4 + 4];
                local_2894 = (uint)bVar31;
                if ((int)uVar15 <= (int)(uint)bVar31) {
                  __assert_fail("vin < vertcountunder",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7f8,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                if ((int)(uint)bVar31 < (int)uVar38) {
                  __assert_fail("vin >= vertcountunderold",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7f9,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
              }
              lVar19 = (long)(int)uVar33;
              abStack_2436[lVar19 * 4] = (byte)local_2894;
              abStack_2436[lVar19 * 4 + 1] = bVar22;
              asStack_1436[uVar30 * 3] = sVar32;
              if ((int)uVar26 < (int)uVar41) {
                sVar16 = asStack_1436[(long)sVar16 * 3];
                if ((long)sVar16 == -1) {
                  __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x805,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                (&local_2438)[lVar19 * 2] = sVar16;
                (&local_2438)[(long)sVar16 * 2] = sVar32;
              }
              if ((int)sVar32 != uVar33) {
                __assert_fail("edgeflag[e0].undermap == under_edge_count",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x80a,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              uVar33 = uVar33 + 1;
            }
          }
        }
LAB_0090594f:
        uVar30 = (ulong)uVar14;
        bVar31 = bVar40;
      } while (uVar14 != uVar17);
      lVar19 = (long)(convex->facets).count;
      if ((bVar40 & 1) != 0) {
        if (lVar19 <= (long)uVar39) {
LAB_00905ddc:
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
          ;
          goto LAB_00905d94;
        }
        lVar27 = (long)iVar34;
        iVar34 = iVar34 + 1;
        local_838[lVar27] = (convex->facets).element[uVar39];
        if (-1 < (int)local_2884) {
          if ((int)local_2894 < 0) {
            __assert_fail("vin>=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x82d,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          if ((int)local_2878 < 0) {
            __assert_fail("coplanaredge>=0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x82e,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          if (local_2878 == 0x1ff) {
            __assert_fail("coplanaredge!=511",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x82f,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          lVar27 = (long)(int)uVar18;
          *(short *)(auStack_1c36 + lVar27 * 4 + -2) = (short)local_2878;
          auStack_1c36[lVar27 * 4] = (uchar)local_2894;
          auStack_1c36[lVar27 * 4 + 1] = (uchar)local_2884;
          uVar18 = uVar18 + 1;
        }
      }
      uVar39 = uVar39 + 1;
      uVar17 = local_2874;
    } while ((long)uVar39 < lVar19);
    bVar42 = 0 < (int)uVar18;
    if ((int)uVar18 < 1) {
      bVar42 = false;
    }
    else {
      fVar1 = (slice->normal).y;
      uVar11 = *(undefined8 *)&(slice->normal).z;
      iVar23 = iVar34 + 1;
      local_838[iVar34].normal.x = (slice->normal).x;
      local_838[iVar34].normal.y = fVar1;
      *(undefined8 *)&local_838[iVar34].normal.z = uVar11;
      iVar34 = iVar23;
      if (uVar18 == 1) {
        bVar42 = true;
        uVar18 = 1;
      }
      else {
        puVar28 = &local_1c38;
        uVar39 = 0;
        uVar38 = uVar18;
        do {
          uVar30 = uVar39 + 1;
          if (auStack_1c36[uVar39 * 4 + 1] != *(uchar *)((long)&local_1c34 + uVar39 * 4 + 2)) {
            if ((int)uVar18 <= (int)uVar39 + 2) {
LAB_00905dbd:
              __assert_fail("j<coplanaredges_num",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x848,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            lVar19 = 2;
            while (auStack_1c36[uVar39 * 4 + 1] != (uchar)puVar28[lVar19 * 2 + 1]) {
              lVar19 = lVar19 + 1;
              if (uVar38 == (uint)lVar19) goto LAB_00905dbd;
            }
            uVar7 = *(undefined4 *)(auStack_1c36 + uVar30 * 4 + -2);
            *(undefined4 *)(auStack_1c36 + uVar30 * 4 + -2) = *(undefined4 *)(puVar28 + lVar19 * 2);
            *(undefined4 *)(puVar28 + lVar19 * 2) = uVar7;
          }
          puVar28 = puVar28 + 2;
          uVar38 = uVar38 - 1;
          uVar39 = uVar30;
        } while (uVar30 != uVar18 - 1);
      }
    }
  }
  this = (ConvexH *)::operator_new(0x30);
  ConvexH::ConvexH(this,uVar15,uVar18 + uVar33,iVar34);
  iVar23 = (convex->vertices).count;
  uVar38 = 0;
  if (0 < iVar23) {
    lVar19 = 0;
    lVar27 = 0;
    uVar38 = 0;
    do {
      if (abStack_2838[lVar27 * 4] != 2) {
        if (((int)uVar38 < 0) || ((this->vertices).count <= (int)uVar38)) goto LAB_00905e31;
        pfVar9 = (convex->vertices).element;
        pfVar10 = (this->vertices).element;
        pfVar10[uVar38].z = *(float *)((long)&pfVar9->z + lVar19);
        uVar11 = *(undefined8 *)((long)&pfVar9->x + lVar19);
        pfVar10 = pfVar10 + uVar38;
        pfVar10->x = (float)(int)uVar11;
        pfVar10->y = (float)(int)((ulong)uVar11 >> 0x20);
        iVar23 = (convex->vertices).count;
        uVar38 = uVar38 + 1;
      }
      lVar27 = lVar27 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar27 < iVar23);
  }
  uVar41 = uVar15 - uVar38;
  uVar17 = 0;
  if (uVar41 != 0 && (int)uVar38 <= (int)uVar15) {
    uVar39 = (ulong)uVar38;
    uVar30 = 0;
    do {
      if ((((long)local_2858.count <= (long)uVar30) || ((int)uVar38 < 0)) ||
         ((this->vertices).count <= (int)uVar39)) goto LAB_00905e31;
      pfVar10 = (this->vertices).element;
      uVar29 = uVar30 + 1;
      pfVar10[uVar39].z = local_2858.element[uVar30].z;
      fVar1 = local_2858.element[uVar30].y;
      pfVar10 = pfVar10 + uVar39;
      pfVar10->x = local_2858.element[uVar30].x;
      pfVar10->y = fVar1;
      uVar39 = uVar39 + 1;
      uVar30 = uVar29;
      uVar17 = uVar41;
    } while (uVar29 != uVar41);
  }
  if (uVar17 != local_2858.count) {
    __assert_fail("i==createdverts.count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x859,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
  }
  if (bVar42) {
    uVar39 = (ulong)uVar33;
    uVar30 = 0;
    do {
      if (((int)uVar33 < 0) || (iVar23 = (int)uVar39, (this->edges).count <= iVar23))
      goto LAB_00905d7f;
      pHVar36 = (this->edges).element;
      pHVar36[uVar39].p = (char)iVar34 + 0xff;
      if ((this->edges).count <= iVar23) goto LAB_00905d7f;
      uVar6 = *(ushort *)(auStack_1c36 + uVar30 * 4 + -2);
      pHVar36[uVar39].ea = uVar6;
      (&local_2438)[(ulong)uVar6 * 2] = (short)uVar39;
      if ((this->edges).count <= iVar23) goto LAB_00905d7f;
      lVar19 = uVar30 * 4;
      uVar30 = uVar30 + 1;
      pHVar36[uVar39].v = auStack_1c36[lVar19];
      uVar39 = uVar39 + 1;
    } while (uVar18 != uVar30);
  }
  else {
    pHVar36 = (this->edges).element;
  }
  memcpy(pHVar36,&local_2438,(long)(int)uVar33 << 2);
  memcpy((this->facets).element,local_838,(long)iVar34 << 4);
  if (local_2858.element != (float3 *)0x0) {
    free(local_2858.element);
  }
  return this;
LAB_00905e31:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
  goto LAB_00905d94;
LAB_00905d7f:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
  ;
LAB_00905d94:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *ConvexHCrop(ConvexH &convex,const Plane &slice)
{
	int i;
	int vertcountunder=0;
	int vertcountover =0;
	static Array<int> vertscoplanar;  // existing vertex members of convex that are coplanar
	vertscoplanar.count=0;
	static Array<int> edgesplit;  // existing edges that members of convex that cross the splitplane
	edgesplit.count=0;

	assert(convex.edges.count<480);

	EdgeFlag  edgeflag[512];
	VertFlag  vertflag[256];
	PlaneFlag planeflag[128];
	HalfEdge  tmpunderedges[512];
	Plane	  tmpunderplanes[128];
	Coplanar coplanaredges[512];
	int coplanaredges_num=0;

	Array<REAL3> createdverts;
	// do the side-of-plane tests
	for(i=0;i<convex.vertices.count;i++) {
		vertflag[i].planetest = PlaneTest(slice,convex.vertices[i]);
		if(vertflag[i].planetest == COPLANAR) {
			// ? vertscoplanar.Add(i);
			vertflag[i].undermap = vertcountunder++;
			vertflag[i].overmap  = vertcountover++;
		}
		else if(vertflag[i].planetest == UNDER)	{
			vertflag[i].undermap = vertcountunder++;
		}
		else {
			assert(vertflag[i].planetest == OVER);
			vertflag[i].overmap  = vertcountover++;
			vertflag[i].undermap = 255; // for debugging purposes
		}
	}
	int vertcountunderold = vertcountunder; // for debugging only

	int under_edge_count =0;
	int underplanescount=0;
	int e0=0;

	for(int currentplane=0; currentplane<convex.facets.count; currentplane++) {
		int estart =e0;
		int enextface = 0;
		int planeside = 0;
		int e1 = e0+1;
		int vout=-1;
		int vin =-1;
		int coplanaredge = -1;
		do{

			if(e1 >= convex.edges.count || convex.edges[e1].p!=currentplane) {
				enextface = e1;
				e1=estart;
			}
			HalfEdge &edge0 = convex.edges[e0];
			HalfEdge &edge1 = convex.edges[e1];
			HalfEdge &edgea = convex.edges[edge0.ea];


			planeside |= vertflag[edge0.v].planetest;
			//if((vertflag[edge0.v].planetest & vertflag[edge1.v].planetest)  == COPLANAR) {
			//	assert(ecop==-1);
			//	ecop=e;
			//}


			if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == OVER){
				// both endpoints over plane
				edgeflag[e0].undermap  = -1;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == UNDER) {
				// at least one endpoint under, the other coplanar or under
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					// connect the neighbors
					assert(edgeflag[edge0.ea].undermap !=-1);
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				under_edge_count++;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == COPLANAR) {
				// both endpoints coplanar 
				// must check a 3rd point to see if UNDER
				int e2 = e1+1;
				if(e2>=convex.edges.count || convex.edges[e2].p!=currentplane) {
					e2 = estart;
				}
				assert(convex.edges[e2].p==currentplane);
				HalfEdge &edge2 = convex.edges[e2];
				if(vertflag[edge2.v].planetest==UNDER) {
					
					edgeflag[e0].undermap = under_edge_count;
					tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					// make sure this edge is added to the "coplanar" list
					coplanaredge = under_edge_count;
					vout = vertflag[edge0.v].undermap;
					vin  = vertflag[edge1.v].undermap;
					under_edge_count++;
				}
				else {
					edgeflag[e0].undermap = -1;
				}
			}
			else if(vertflag[edge0.v].planetest == UNDER && vertflag[edge1.v].planetest == OVER) {
				// first is under 2nd is over 
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
					vout = tmpunderedges[edgeflag[edge0.ea].undermap].v;
				}
				else {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					vout = vertcountunder++;
				}
				under_edge_count++;
				/// hmmm something to think about: i might be able to output this edge regarless of 
				// wheter or not we know v-in yet.  ok i;ll try this now:
				tmpunderedges[under_edge_count].v = vout;
				tmpunderedges[under_edge_count].p = underplanescount;
				tmpunderedges[under_edge_count].ea = -1;
				coplanaredge = under_edge_count;
				under_edge_count++;

				if(vin!=-1) {
					// we previously processed an edge  where we came under
					// now we know about vout as well

					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else if(vertflag[edge0.v].planetest == COPLANAR && vertflag[edge1.v].planetest == OVER) {
				// first is coplanar 2nd is over 
				
				edgeflag[e0].undermap = -1;
				vout = vertflag[edge0.v].undermap;
				// I hate this but i have to make sure part of this face is UNDER before ouputting this vert
				int k=estart;
				assert(edge0.p == currentplane);
				while(!(planeside&UNDER) && k<convex.edges.count && convex.edges[k].p==edge0.p) {
					planeside |= vertflag[convex.edges[k].v].planetest;
					k++;
				}
				if(planeside&UNDER){
					tmpunderedges[under_edge_count].v = vout;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					coplanaredge = under_edge_count; // hmmm should make a note of the edge # for later on
					under_edge_count++;
					
				}
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == UNDER) {
				// first is over next is under 
				// new vertex!!!
				assert(vin==-1);
				if(e0<edge0.ea) {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					vin = vertcountunder++;
				}
				else {
					// find the new vertex that was created by edge[edge0.ea]
					int nea = edgeflag[edge0.ea].undermap;
					assert(tmpunderedges[nea].p==tmpunderedges[nea+1].p);
					vin = tmpunderedges[nea+1].v;
					assert(vin < vertcountunder);
					assert(vin >= vertcountunderold);   // for debugging only
				}
				if(vout!=-1) {
					// we previously processed an edge  where we went over
					// now we know vin too
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}
				// output edge
				tmpunderedges[under_edge_count].v = vin;
				tmpunderedges[under_edge_count].p = underplanescount;
				edgeflag[e0].undermap = under_edge_count;
				if(e0>edge0.ea) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				assert(edgeflag[e0].undermap == under_edge_count);
				under_edge_count++;
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == COPLANAR) {
				// first is over next is coplanar 
				
				edgeflag[e0].undermap = -1;
				vin = vertflag[edge1.v].undermap;
				assert(vin!=-1);
				if(vout!=-1) {
					// we previously processed an edge  where we came under
					// now we know both endpoints
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else {
				assert(0);
			}
			

			e0=e1;
			e1++; // do the modulo at the beginning of the loop

		} while(e0!=estart) ;
		e0 = enextface;
		if(planeside&UNDER) {
			planeflag[currentplane].undermap = underplanescount;
			tmpunderplanes[underplanescount] = convex.facets[currentplane];
			underplanescount++;
		}
		else {
			planeflag[currentplane].undermap = 0;
		}
		if(vout>=0 && (planeside&UNDER)) {
			assert(vin>=0);
			assert(coplanaredge>=0);
			assert(coplanaredge!=511);
			coplanaredges[coplanaredges_num].ea = coplanaredge;
			coplanaredges[coplanaredges_num].v0 = vin;
			coplanaredges[coplanaredges_num].v1 = vout;
			coplanaredges_num++;
		}
	}

	// add the new plane to the mix:
	if(coplanaredges_num>0) {
		tmpunderplanes[underplanescount++]=slice;
	}
	for(i=0;i<coplanaredges_num-1;i++) {
		if(coplanaredges[i].v1 != coplanaredges[i+1].v0) {
			int j = 0;
			for(j=i+2;j<coplanaredges_num;j++) {
				if(coplanaredges[i].v1 == coplanaredges[j].v0) {
					Coplanar tmp = coplanaredges[i+1];
					coplanaredges[i+1] = coplanaredges[j];
					coplanaredges[j] = tmp;
					break;
				}
			}
			if(j>=coplanaredges_num)
			{
				assert(j<coplanaredges_num);
				return NULL;
			}
		}
	}
	ConvexH *punder = new ConvexH(vertcountunder,under_edge_count+coplanaredges_num,underplanescount);
	ConvexH &under = *punder;
	int k=0;
	for(i=0;i<convex.vertices.count;i++) {
		if(vertflag[i].planetest != OVER){
			under.vertices[k++] = convex.vertices[i];
		}
	}
	i=0;
	while(k<vertcountunder) {
		under.vertices[k++] = createdverts[i++];
	}
	assert(i==createdverts.count);

	for(i=0;i<coplanaredges_num;i++) {
		under.edges[under_edge_count+i].p  = underplanescount-1;
		under.edges[under_edge_count+i].ea = coplanaredges[i].ea;
		tmpunderedges[coplanaredges[i].ea].ea = under_edge_count+i;
		under.edges[under_edge_count+i].v  = coplanaredges[i].v0;
	}
	
	memcpy(under.edges.element,tmpunderedges,sizeof(HalfEdge)*under_edge_count);
	memcpy(under.facets.element,tmpunderplanes,sizeof(Plane)*underplanescount);
	return punder;
}